

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O3

void ExpReplay::multipredict
               (expreplay *param_1,single_learner *base,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  size_t sVar4;
  uint64_t uVar5;
  size_t sVar6;
  int iVar7;
  
  iVar7 = (int)count;
  uVar5 = (ulong)(uint)(*(int *)(base + 0xe0) * iVar7) + (ec->super_example_predict).ft_offset;
  lVar1 = *(long *)(base + 0x40);
  (ec->super_example_predict).ft_offset = uVar5;
  if (lVar1 == 0) {
    if (step != 0) {
      sVar6 = step;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        if (finalize_predictions) {
          pfVar2 = (ec->pred).scalars._begin;
          pfVar3 = (ec->pred).scalars._end;
          sVar4 = (ec->pred).scalars.erase_count;
          (pred->scalars).end_array = (ec->pred).scalars.end_array;
          (pred->scalars).erase_count = sVar4;
          (pred->scalars)._begin = pfVar2;
          (pred->scalars)._end = pfVar3;
        }
        else {
          pred->scalar = ec->partial_prediction;
        }
        uVar5 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar5;
        pred = pred + 1;
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
    }
    uVar5 = uVar5 - (uint)(((int)step + iVar7) * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,step,
               *(undefined8 *)(base + 0xe0),pred,finalize_predictions);
    uVar5 = (ec->super_example_predict).ft_offset - (ulong)(uint)(iVar7 * *(int *)(base + 0xe0));
  }
  (ec->super_example_predict).ft_offset = uVar5;
  return;
}

Assistant:

void multipredict(expreplay&, LEARNER::single_learner& base, example& ec, size_t count, size_t step,
    polyprediction* pred, bool finalize_predictions)
{
  base.multipredict(ec, count, step, pred, finalize_predictions);
}